

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

void * realloc_array(void *src,size_t old_n,size_t new_n,size_t size)

{
  uchar *p;
  size_t size_local;
  size_t new_n_local;
  size_t old_n_local;
  void *src_local;
  
  src_local = wally_malloc(new_n * size);
  if (src_local == (void *)0x0) {
    src_local = (void *)0x0;
  }
  else {
    if (src != (void *)0x0) {
      memcpy(src_local,src,old_n * size);
    }
    wally_clear((void *)((long)src_local + old_n * size),(new_n - old_n) * size);
  }
  return src_local;
}

Assistant:

void *realloc_array(const void *src, size_t old_n, size_t new_n, size_t size)
{
    unsigned char *p = wally_malloc(new_n * size);
    if (!p)
        return NULL;
    if (src)
        memcpy(p, src, old_n * size);
    wally_clear(p + old_n * size, (new_n - old_n) * size);
    return p;
}